

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

void Dtt_FunImplFI2Str(int FI,int NP,Vec_Int_t *vLibFun,char *str)

{
  int i;
  uint uVar1;
  long lVar2;
  int N [5];
  int P [5];
  
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    P[lVar2] = NP & 7;
    N[lVar2] = (uint)NP >> 3 & 1;
    NP = NP >> 4;
  }
  uVar1 = Vec_IntEntry(vLibFun,FI);
  sprintf(str,"[%08x(%03d),%d%d%d%d%d,%d%d%d%d%d]",(ulong)uVar1,FI,(ulong)(uint)P[0],
          (ulong)(uint)P[1],(ulong)(uint)P[2],(ulong)(uint)P[3],(ulong)(uint)P[4],(ulong)(uint)N[0],
          (ulong)(uint)N[1],(ulong)(uint)N[2],(ulong)(uint)N[3],(ulong)(uint)N[4]);
  return;
}

Assistant:

void Dtt_FunImplFI2Str( int FI, int NP, Vec_Int_t* vLibFun, char* str )
{
    int i, P[5], N[5];
    for ( i = 0; i < 5; i++ )
    {
        P[i] = NP & 0x7;
        NP = NP >> 3;
        N[i] = NP & 0x1;
        NP = NP >> 1 ;
    }
    sprintf( str, "[%08x(%03d),%d%d%d%d%d,%d%d%d%d%d]", Vec_IntEntry( vLibFun, FI ), FI, P[0], P[1], P[2], P[3], P[4], N[0], N[1], N[2], N[3], N[4] ); 
}